

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_34::BrokenClient::BrokenClient
          (BrokenClient *this,StringPtr description,bool resolved,void *brand)

{
  StringPtr *params;
  String local_48;
  void *local_30;
  void *brand_local;
  BrokenClient *pBStack_20;
  bool resolved_local;
  BrokenClient *this_local;
  StringPtr description_local;
  
  description_local.content.ptr = (char *)description.content.size_;
  this_local = (BrokenClient *)description.content.ptr;
  local_30 = brand;
  brand_local._7_1_ = resolved;
  pBStack_20 = this;
  ClientHook::ClientHook(&this->super_ClientHook,brand);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_0059afc8;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_0059b018;
  kj::str<kj::StringPtr_const&>(&local_48,(kj *)&this_local,params);
  kj::Exception::Exception(&this->exception,FAILED,"",0,&local_48);
  kj::String::~String(&local_48);
  this->resolved = (bool)(brand_local._7_1_ & 1);
  return;
}

Assistant:

BrokenClient(const kj::StringPtr description, bool resolved, const void* brand)
      : ClientHook(brand), exception(kj::Exception::Type::FAILED, "", 0, kj::str(description)),
        resolved(resolved) {}